

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_close(intptr_t uuid)

{
  int __epfd;
  int iVar1;
  int *piVar2;
  long lVar3;
  uint __fd;
  uint32_t local_2c;
  uint local_28;
  
  if (((uuid < 0) || (__fd = (uint)((ulong)uuid >> 8), fio_data->capa <= __fd)) ||
     (lVar3 = (long)(int)__fd * 0xa8, *(char *)((long)fio_data + lVar3 + 0x6d) != (char)uuid)) {
    piVar2 = __errno_location();
    *piVar2 = 9;
  }
  else {
    if ((*(long *)((long)fio_data + lVar3 + 0x40) == 0) &&
       (*(char *)((long)fio_data + lVar3 + 0x6e) == '\0')) {
      fio_force_close(uuid);
      return;
    }
    *(undefined1 *)((long)fio_data + lVar3 + 0x70) = 1;
    __epfd = evio_fd[2];
    piVar2 = __errno_location();
    do {
      *piVar2 = 0;
      local_2c = 0x40002014;
      local_28 = __fd;
      iVar1 = epoll_ctl(__epfd,3,__fd,(epoll_event *)&local_2c);
      if ((iVar1 == -1) && (*piVar2 == 2)) {
        *piVar2 = 0;
        local_2c = 0x40002014;
        local_28 = __fd;
        epoll_ctl(__epfd,1,__fd,(epoll_event *)&local_2c);
      }
    } while (*piVar2 == 4);
  }
  return;
}

Assistant:

void fio_close(intptr_t uuid) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return;
  }
  if (uuid_data(uuid).packet || uuid_data(uuid).sock_lock) {
    uuid_data(uuid).close = 1;
    fio_poll_add_write(fio_uuid2fd(uuid));
    return;
  }
  fio_force_close(uuid);
}